

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_markdown_generator.cc
# Opt level: O0

void __thiscall
t_markdown_generator::generate_typedef(t_markdown_generator *this,t_typedef *ttypedef)

{
  int iVar1;
  undefined4 extraout_var;
  ostream *poVar2;
  t_type *ttype;
  string local_38 [8];
  string name;
  t_typedef *ttypedef_local;
  t_markdown_generator *this_local;
  
  name.field_2._8_8_ = ttypedef;
  iVar1 = (*(ttypedef->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string(local_38,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<((ostream *)&this->f_out_,"### Typedef: ");
  poVar2 = std::operator<<(poVar2,local_38);
  std::operator<<(poVar2,'\n');
  print_doc(this,(t_doc *)name.field_2._8_8_);
  poVar2 = std::operator<<((ostream *)&this->f_out_,'\n');
  std::operator<<(poVar2,'\n');
  std::operator<<((ostream *)&this->f_out_,"_Base type_: **");
  ttype = t_typedef::get_type((t_typedef *)name.field_2._8_8_);
  print_type(this,ttype);
  poVar2 = std::operator<<((ostream *)&this->f_out_,"**");
  poVar2 = std::operator<<(poVar2,'\n');
  std::operator<<(poVar2,'\n');
  std::operator<<((ostream *)&this->f_out_,'\n');
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void t_markdown_generator::generate_typedef(t_typedef* ttypedef) {
  string name = ttypedef->get_name();
  f_out_ << "### Typedef: " << name  << endl;
  print_doc(ttypedef);
  f_out_ << endl << endl;
  f_out_ << "_Base type_: **";
  print_type(ttypedef->get_type());
  f_out_ << "**" << endl << endl;
  f_out_ << endl;
}